

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

S2CellId s2textformat::MakeCellIdOrDie(string_view str)

{
  S2CellId SVar1;
  ostream *poVar2;
  size_type sVar3;
  size_type in_RDX;
  string_view str_00;
  string_view piece;
  S2LogMessage SStack_28;
  
  str_00.ptr_ = (char *)str.length_;
  str_00.length_ = in_RDX;
  SVar1 = S2CellId::FromDebugString((S2CellId *)str.ptr_,str_00);
  if (SVar1.id_ != 0) {
    return (S2CellId)SVar1.id_;
  }
  sVar3 = 3;
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x8f,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: MakeCellId(str, &cell_id) ",0x28);
  std::__ostream_insert<char,std::char_traits<char>>(SStack_28.stream_,": str == \"",10);
  piece.length_ = sVar3;
  piece.ptr_ = str_00.ptr_;
  poVar2 = absl::operator<<((absl *)SStack_28.stream_,(ostream *)str.ptr_,piece);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  abort();
}

Assistant:

S2CellId MakeCellIdOrDie(string_view str) {
  S2CellId cell_id;
  S2_CHECK(MakeCellId(str, &cell_id)) << ": str == \"" << str << "\"";
  return cell_id;
}